

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_comment.cpp
# Opt level: O0

void __thiscall Comment_BashDisabled_Test::TestBody(Comment_BashDisabled_Test *this)

{
  bool bVar1;
  parser<callbacks_proxy<mock_json_callbacks>_> *this_00;
  char *message;
  extensions in_ECX;
  char *in_R9;
  string local_128;
  AssertHelper local_108;
  Message local_100;
  bool local_f1;
  undefined1 local_f0 [8];
  AssertionResult gtest_ar_;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  undefined1 local_b0 [8];
  parser<callbacks_proxy<mock_json_callbacks>_> p;
  Comment_BashDisabled_Test *this_local;
  
  p.coordinate_ = (coord)this;
  pstore::json::make_parser<callbacks_proxy<mock_json_callbacks>>
            ((parser<callbacks_proxy<mock_json_callbacks>_> *)local_b0,
             (json *)&(this->super_Comment).proxy_,(callbacks_proxy<mock_json_callbacks> *)0x0,
             in_ECX);
  s_abi_cxx11_(&local_d0,"# comment\nnull",0xe);
  this_00 = pstore::json::parser<callbacks_proxy<mock_json_callbacks>_>::input
                      ((parser<callbacks_proxy<mock_json_callbacks>_> *)local_b0,&local_d0);
  pstore::json::parser<callbacks_proxy<mock_json_callbacks>_>::eof(this_00);
  std::__cxx11::string::~string((string *)&local_d0);
  local_f1 = pstore::json::parser<callbacks_proxy<mock_json_callbacks>_>::has_error
                       ((parser<callbacks_proxy<mock_json_callbacks>_> *)local_b0);
  testing::AssertionResult::AssertionResult<bool>((AssertionResult *)local_f0,&local_f1,(type *)0x0)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_f0);
  if (!bVar1) {
    testing::Message::Message(&local_100);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_128,(internal *)local_f0,(AssertionResult *)"p.has_error ()","false","true",
               in_R9);
    message = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_108,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/json/test_comment.cpp"
               ,0x28,message);
    testing::internal::AssertHelper::operator=(&local_108,&local_100);
    testing::internal::AssertHelper::~AssertHelper(&local_108);
    std::__cxx11::string::~string((string *)&local_128);
    testing::Message::~Message(&local_100);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_f0);
  pstore::json::parser<callbacks_proxy<mock_json_callbacks>_>::~parser
            ((parser<callbacks_proxy<mock_json_callbacks>_> *)local_b0);
  return;
}

Assistant:

TEST_F (Comment, BashDisabled) {
    json::parser<decltype (proxy_)> p = json::make_parser (proxy_);
    p.input ("# comment\nnull"s).eof ();
    EXPECT_TRUE (p.has_error ());
}